

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picnic3_tree.c
# Opt level: O0

size_t revealSeeds(tree_t *tree,uint16_t *hideList,size_t hideListSize,uint8_t *output,
                  size_t outputSize,picnic_instance_t *params)

{
  uint *__ptr;
  size_t *in_RSI;
  size_t in_RDI;
  size_t i;
  uint *revealed;
  size_t revealedSize;
  uint8_t *outputBase;
  uint16_t *in_stack_fffffffffffffff8;
  
  __ptr = getRevealedNodes((tree_t *)i,in_stack_fffffffffffffff8,in_RDI,in_RSI);
  free(__ptr);
  return 0;
}

Assistant:

size_t revealSeeds(tree_t* tree, uint16_t* hideList, size_t hideListSize, uint8_t* output,
                   size_t outputSize, const picnic_instance_t* params) {
  uint8_t* outputBase = output;
  size_t revealedSize = 0;

  unsigned int* revealed = getRevealedNodes(tree, hideList, hideListSize, &revealedSize);
  if (outputSize < params->seed_size * revealedSize) {
    assert(!"Insufficient sized buffer provided to revealSeeds");
    free(revealed);
    return 0;
  }

  for (size_t i = 0; i < revealedSize; i++) {
    memcpy(output, &tree->nodes[revealed[i] * params->seed_size], params->seed_size);
    output += params->seed_size;
  }

  free(revealed);
  return output - outputBase;
}